

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void file_base_2_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_wrap_stringstream<char> *pbVar2;
  const_string local_258;
  const_string local_248;
  const_string local_238;
  const_string local_228;
  const_string local_218;
  basic_wrap_stringstream<char> local_208;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  const_string local_30;
  
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_70.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"file_base_2");
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = &local_208;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_258.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_258.m_end = local_258.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_70,0x21,&local_258);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"file_base_2");
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = &local_208;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_248.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_248.m_end = local_248.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_60,0x21,&local_248);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_50.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"file_base_2");
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = &local_208;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_238.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_238.m_end = local_238.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_50,0x21,&local_238);
  pbVar2 = &local_208;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  file_base_2::test_method((file_base_2 *)pbVar2);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_40.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"file_base_2");
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = &local_208;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_228.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_228.m_end = local_228.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_40,0x21,&local_228);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  local_30.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_30.m_end = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"file_base_2");
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = &local_208;
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  local_218.m_begin = (pbVar1->_M_dataplus)._M_p;
  local_218.m_end = local_218.m_begin + pbVar1->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar2,&local_30,0x21,&local_218);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_base_2 )
{
    BOOST_CHECK_EQUAL( ah::file_base( "a", 2 ), "a" );
    BOOST_CHECK_EQUAL( ah::file_base( "a.txt", 2 ), "a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( ".a.txt", 2 ), ".a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( "dev/null", 2 ), "dev/null" );
    BOOST_CHECK_EQUAL( ah::file_base( "/Users/todi/assert_hash/build", 2 ), "/assert_hash/build" );
    BOOST_CHECK_EQUAL( ah::file_base( "c:\\asda\\asdasd\\asd\\.a.txt", 2 ), "\\asd\\.a.txt" );
}